

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
~ExceptionOr(ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
             *this)

{
  NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  ~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;